

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putkey.c
# Opt level: O1

int ffcrtb(fitsfile *fptr,int tbltype,LONGLONG naxis2,int tfields,char **ttype,char **tform,
          char **tunit,char *extnm,int *status)

{
  FITSfile *pFVar1;
  int iVar2;
  
  iVar2 = *status;
  if (iVar2 < 1) {
    if (fptr->HDUposition != fptr->Fptr->curhdu) {
      ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
    }
    pFVar1 = fptr->Fptr;
    if (pFVar1->headend != pFVar1->headstart[pFVar1->curhdu]) {
      ffcrhd(fptr,status);
    }
    if (fptr->Fptr->curhdu == 0) {
      ffcrim(fptr,0x10,0,(long *)0x0,status);
      ffcrhd(fptr,status);
    }
    if (tbltype == 1) {
      ffphtb(fptr,0,naxis2,tfields,ttype,(long *)0x0,tform,tunit,extnm,status);
    }
    else if (tbltype == 2) {
      ffphbn(fptr,naxis2,tfields,ttype,tform,tunit,extnm,0,status);
    }
    else {
      *status = 0xeb;
    }
    iVar2 = *status;
  }
  return iVar2;
}

Assistant:

int ffcrtb(fitsfile *fptr,  /* I - FITS file pointer                        */
           int tbltype,     /* I - type of table to create                  */
           LONGLONG naxis2, /* I - number of rows in the table              */
           int tfields,     /* I - number of columns in the table           */
           char **ttype,    /* I - name of each column                      */
           char **tform,    /* I - value of TFORMn keyword for each column  */
           char **tunit,    /* I - value of TUNITn keyword for each column  */
           const char *extnm, /* I - value of EXTNAME keyword, if any         */
           int *status)     /* IO - error status                            */
/*
  Create a table extension in a FITS file. 
*/
{
    LONGLONG naxis1 = 0;
    long *tbcol = 0;

    if (*status > 0)
        return(*status);

    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    /* create new extension if current header is not empty */
    if ((fptr->Fptr)->headend != (fptr->Fptr)->headstart[(fptr->Fptr)->curhdu] )
        ffcrhd(fptr, status);

    if ((fptr->Fptr)->curhdu == 0)  /* have to create dummy primary array */
    {
       ffcrim(fptr, 16, 0, tbcol, status);
       ffcrhd(fptr, status);
    }
    
    if (tbltype == BINARY_TBL)
    {
      /* write the required header keywords. This will write PCOUNT = 0 */
      ffphbn(fptr, naxis2, tfields, ttype, tform, tunit, extnm, 0, status);
    }
    else if (tbltype == ASCII_TBL)
    {
      /* write the required header keywords */
      /* default values for naxis1 and tbcol will be calculated */
      ffphtb(fptr, naxis1, naxis2, tfields, ttype, tbcol, tform, tunit,
             extnm, status);
    }
    else
      *status = NOT_TABLE;

    return(*status);
}